

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio_mem.cc
# Opt level: O1

long mem_ctrl(BIO *bio,int cmd,long num,void *ptr)

{
  size_t *psVar1;
  void *__s;
  size_t __n;
  size_t sVar2;
  int iVar3;
  char **out;
  
  psVar1 = (size_t *)bio->ptr;
  sVar2 = 0;
  iVar3 = (int)num;
  if (0x71 < cmd) {
    if (cmd == 0x72) {
      mem_free(bio);
      bio->shutdown = iVar3;
      bio->ptr = ptr;
    }
    else {
      if (cmd == 0x73) {
        if (ptr == (void *)0x0) {
          return 1;
        }
        *(size_t **)ptr = psVar1;
        return 1;
      }
      if (cmd != 0x82) {
        return 0;
      }
      bio->num = iVar3;
    }
    goto switchD_00175fe9_caseD_b;
  }
  switch(cmd) {
  case 1:
    __s = (void *)psVar1[1];
    sVar2 = 1;
    if (__s != (void *)0x0) {
      __n = psVar1[2];
      if ((bio->flags & 0x200) == 0) {
        if (__n != 0) {
          memset(__s,0,__n);
        }
        *psVar1 = 0;
      }
      else {
        psVar1[1] = (long)__s + (*psVar1 - __n);
        *psVar1 = __n;
      }
    }
    break;
  case 2:
    sVar2 = (size_t)(*psVar1 == 0);
    break;
  case 3:
    if (ptr != (void *)0x0) {
      *(size_t *)ptr = psVar1[1];
    }
  case 10:
    sVar2 = *psVar1;
    break;
  case 8:
    sVar2 = (size_t)bio->shutdown;
    break;
  case 9:
    bio->shutdown = iVar3;
  case 0xb:
switchD_00175fe9_caseD_b:
    sVar2 = 1;
  }
  return sVar2;
}

Assistant:

static long mem_ctrl(BIO *bio, int cmd, long num, void *ptr) {
  BUF_MEM *b = static_cast<BUF_MEM *>(bio->ptr);
  switch (cmd) {
    case BIO_CTRL_RESET:
      if (b->data != NULL) {
        // For read only case reset to the start again
        if (bio->flags & BIO_FLAGS_MEM_RDONLY) {
          b->data -= b->max - b->length;
          b->length = b->max;
        } else {
          OPENSSL_memset(b->data, 0, b->max);
          b->length = 0;
        }
      }
      return 1;
    case BIO_CTRL_EOF:
      return b->length == 0;
    case BIO_C_SET_BUF_MEM_EOF_RETURN:
      bio->num = static_cast<int>(num);
      return 1;
    case BIO_CTRL_INFO:
      if (ptr != nullptr) {
        char **out = reinterpret_cast<char **>(ptr);
        *out = b->data;
      }
      // This API can overflow on 64-bit Windows, where |long| is smaller than
      // |ptrdiff_t|. |BIO_mem_contents| is the overflow-safe API.
      return static_cast<long>(b->length);
    case BIO_C_SET_BUF_MEM:
      mem_free(bio);
      bio->shutdown = static_cast<int>(num);
      bio->ptr = ptr;
      return 1;
    case BIO_C_GET_BUF_MEM_PTR:
      if (ptr != NULL) {
        BUF_MEM **out = reinterpret_cast<BUF_MEM **>(ptr);
        *out = b;
      }
      return 1;
    case BIO_CTRL_GET_CLOSE:
      return bio->shutdown;
    case BIO_CTRL_SET_CLOSE:
      bio->shutdown = static_cast<int>(num);
      return 1;
    case BIO_CTRL_WPENDING:
      return 0;
    case BIO_CTRL_PENDING:
      // TODO(crbug.com/412584975): This can overflow on 64-bit Windows.
      return static_cast<long>(b->length);
    case BIO_CTRL_FLUSH:
      return 1;
    default:
      return 0;
  }
}